

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::BasicComputeTestInstance::configCommandBuffer
          (BasicComputeTestInstance *this)

{
  VkPipelineStageFlagBits VVar1;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  bool bVar4;
  VkResult VVar5;
  VkCommandBufferInheritanceInfo *pVVar6;
  VkCommandBuffer_s **ppVVar7;
  Handle<(vk::HandleType)11> *pHVar8;
  Handle<(vk::HandleType)18> *pHVar9;
  Handle<(vk::HandleType)16> *pHVar10;
  Handle<(vk::HandleType)22> *pHVar11;
  reference pVVar12;
  __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
  local_68;
  __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
  local_60;
  const_iterator it;
  deUint32 timestampEntry;
  undefined8 local_38;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  DeviceInterface *vk;
  BasicComputeTestInstance *this_local;
  
  pVVar6 = (VkCommandBufferInheritanceInfo *)
           Context::getDeviceInterface
                     ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  local_38 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = pVVar6;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar5 = (*(*(_func_int ***)pVVar6)[0x49])(pVVar6,*ppVVar7,&local_38);
  ::vk::checkResult(VVar5,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x6e6);
  pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar7;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                     (&(this->super_TimestampTestInstance).m_queryPool.
                       super_RefBase<vk::Handle<(vk::HandleType)11>_>);
  (**(code **)(*(long *)pVVar6 + 0x380))(pVVar6,pVVar2,pHVar8->m_internal,0,8);
  pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar7;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->m_computePipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (**(code **)(*(long *)pVVar6 + 0x260))(pVVar6,pVVar2,1,pHVar9->m_internal);
  pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar7;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  dVar3 = pHVar10->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (**(code **)(*(long *)pVVar6 + 0x2b0))(pVVar6,pVVar2,1,dVar3,0,1,pHVar11,0,0);
  pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  (**(code **)(*(long *)pVVar6 + 0x2e8))(pVVar6,*ppVVar7,0x80,1);
  it._M_current._4_4_ = 0;
  local_60._M_current =
       (VkPipelineStageFlagBits *)
       std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::begin
                 (&(this->super_TimestampTestInstance).m_stages);
  while( true ) {
    local_68._M_current =
         (VkPipelineStageFlagBits *)
         std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::end
                   (&(this->super_TimestampTestInstance).m_stages);
    bVar4 = __gnu_cxx::operator!=(&local_60,&local_68);
    pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
    if (!bVar4) break;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pVVar12 = __gnu_cxx::
              __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
              ::operator*(&local_60);
    VVar1 = *pVVar12;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                       (&(this->super_TimestampTestInstance).m_queryPool.
                         super_RefBase<vk::Handle<(vk::HandleType)11>_>);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
    (**(code **)(*(long *)pVVar6 + 0x388))(pVVar6,pVVar2,VVar1,pHVar8->m_internal);
    __gnu_cxx::
    __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
    ::operator++(&local_60,0);
  }
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar5 = (**(code **)(*(long *)pVVar6 + 0x250))(pVVar6,*ppVVar7);
  ::vk::checkResult(VVar5,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x6f4);
  return;
}

Assistant:

void BasicComputeTestInstance::configCommandBuffer(void)
{
	const DeviceInterface&     vk                 = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType          sType;
		DE_NULL,                                        // const void*              pNext;
		0u,                                             // VkCmdBufferOptimizeFlags flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,

	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	vk.cmdResetQueryPool(*m_cmdBuffer, *m_queryPool, 0u, TimestampTest::ENTRY_COUNT);

	vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_computePipelines);
	vk.cmdBindDescriptorSets(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);
	vk.cmdDispatch(*m_cmdBuffer, 128u, 1u, 1u);

	deUint32 timestampEntry = 0u;
	for (StageFlagVector::const_iterator it = m_stages.begin(); it != m_stages.end(); it++)
	{
		vk.cmdWriteTimestamp(*m_cmdBuffer, *it, *m_queryPool, timestampEntry++);
	}

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));


}